

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_pq.c
# Opt level: O2

void bubble_up(nghttp2_pq *pq,size_t index)

{
  nghttp2_pq_entry **ppnVar1;
  nghttp2_pq_entry *pnVar2;
  nghttp2_pq_entry *pnVar3;
  int iVar4;
  ulong uVar5;
  
  while( true ) {
    if (index == 0) {
      return;
    }
    uVar5 = index - 1 >> 1;
    iVar4 = (*pq->less)(pq->q[index],pq->q[uVar5]);
    if (iVar4 == 0) break;
    ppnVar1 = pq->q;
    pnVar2 = ppnVar1[uVar5];
    pnVar3 = ppnVar1[index];
    ppnVar1[uVar5] = pnVar3;
    pnVar3->index = uVar5;
    pq->q[index] = pnVar2;
    pnVar2->index = index;
    index = uVar5;
  }
  return;
}

Assistant:

static void bubble_up(nghttp2_pq *pq, size_t index) {
  size_t parent;
  while (index != 0) {
    parent = (index - 1) / 2;
    if (!pq->less(pq->q[index], pq->q[parent])) {
      return;
    }
    swap(pq, parent, index);
    index = parent;
  }
}